

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O3

void __thiscall QFutureInterfaceBase::setSuspended(QFutureInterfaceBase *this,bool suspend)

{
  QAtomicInt *pQVar1;
  __pointer_type copy;
  QFutureInterfaceBasePrivate *this_00;
  QFutureInterfaceBasePrivate *pQVar2;
  int i;
  ulong uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QFutureCallOutEvent local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->d;
  if (this_00 != (QFutureInterfaceBasePrivate *)0x0) {
    if ((((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
        (__pointer_type)0x0) {
      LOCK();
      bVar4 = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
              (__pointer_type)0x0;
      if (bVar4) {
        (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
             (__pointer_type)0x1;
      }
      UNLOCK();
      if (bVar4) goto LAB_001edeca;
    }
    QBasicMutex::lockInternal((QBasicMutex *)this_00);
  }
LAB_001edeca:
  if (suspend) {
    LOCK();
    pQVar1 = &this->d->state;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i | 0x10;
    UNLOCK();
    pQVar2 = this->d;
    QEvent::QEvent(&local_68.super_QEvent,FutureCallOut);
    local_68.super_QEvent._vptr_QEvent = (_func_int **)&PTR__QFutureCallOutEvent_0069e640;
    local_68.callOutType = Suspending;
    local_68.index1 = -1;
    local_68.index2 = -1;
    local_68.text.d.size = 0;
    local_68.text.d.d = (Data *)0x0;
    local_68.text.d.ptr = (char16_t *)0x0;
    if ((pQVar2->outputConnections).d.size != 0) {
      uVar3 = 0;
      do {
        (*(pQVar2->outputConnections).d.ptr[uVar3]->_vptr_QFutureCallOutInterface[2])();
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)(pQVar2->outputConnections).d.size);
    }
  }
  else {
    LOCK();
    pQVar1 = &this->d->state;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i & 0xffffffcf;
    UNLOCK();
    QWaitCondition::wakeAll(&this->d->pausedWaitCondition);
    pQVar2 = this->d;
    QEvent::QEvent(&local_68.super_QEvent,FutureCallOut);
    local_68.super_QEvent._vptr_QEvent = (_func_int **)&PTR__QFutureCallOutEvent_0069e640;
    local_68.callOutType = Resumed;
    local_68.index1 = -1;
    local_68.index2 = -1;
    local_68.text.d.size = 0;
    local_68.text.d.d = (Data *)0x0;
    local_68.text.d.ptr = (char16_t *)0x0;
    if ((pQVar2->outputConnections).d.size != 0) {
      uVar3 = 0;
      do {
        (*(pQVar2->outputConnections).d.ptr[uVar3]->_vptr_QFutureCallOutInterface[2])();
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)(pQVar2->outputConnections).d.size);
    }
  }
  QFutureCallOutEvent::~QFutureCallOutEvent(&local_68);
  if (this_00 != (QFutureInterfaceBasePrivate *)0x0) {
    LOCK();
    copy = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p;
    (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
         (__pointer_type)0x0;
    UNLOCK();
    if (copy != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBase::setSuspended(bool suspend)
{
    QMutexLocker locker(&d->m_mutex);
    if (suspend) {
        switch_on(d->state, Suspending);
        d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::Suspending));
    } else {
        switch_off(d->state, suspendingOrSuspended);
        d->pausedWaitCondition.wakeAll();
        d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::Resumed));
    }
}